

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.hpp
# Opt level: O2

void __thiscall
pstore::exchange::export_ns::emit_string<char_const*>
          (export_ns *this,ostream_base *os,char *first,char *last)

{
  char *pcVar1;
  ostream_base *this_00;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  void *__buf_01;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  
  ostream_base::write((ostream_base *)this,0x22,first,(size_t)last);
  while( true ) {
    pcVar1 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::exchange::export_ns::emit_string<char_const*>(pstore::exchange::export_ns::ostream_base&,char_const*,char_const*)::_lambda(char)_1_>>
                       (os,first);
    if (pcVar1 == first) break;
    local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<char_const>((char *)os,(long)pcVar1 - (long)os);
    details::write_span<char_const,_1l>((ostream_base *)this,(span<const_char,__1L> *)&local_40);
    this_00 = (ostream_base *)ostream_base::write((ostream_base *)this,0x5c,__buf,(size_t)last);
    ostream_base::write(this_00,(int)*pcVar1,__buf_00,(size_t)last);
    os = (ostream_base *)(pcVar1 + 1);
  }
  __buf_01 = extraout_RDX;
  if (os != (ostream_base *)first) {
    local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<char_const>((char *)os,(long)first - (long)os);
    details::write_span<char_const,_1l>((ostream_base *)this,(span<const_char,__1L> *)&local_40);
    __buf_01 = extraout_RDX_00;
  }
  ostream_base::write((ostream_base *)this,0x22,__buf_01,(size_t)last);
  return;
}

Assistant:

void emit_string (ostream_base & os, Iterator first, Iterator last) {
                os << '"';
                auto pos = first;
                while ((pos = std::find_if (first, last, [] (char const c) {
                            return c == '"' || c == '\\';
                        })) != last) {
                    details::write_span (os, gsl::make_span (&*first, pos - first));
                    os << '\\' << *pos;
                    first = pos + 1;
                }
                if (first != last) {
                    details::write_span (os, gsl::make_span (&*first, last - first));
                }
                os << '"';
            }